

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_pecho(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  char *txt;
  CHAR_DATA *ch_00;
  char *txt_00;
  char arg [4608];
  char buffer [9216];
  char local_3638 [4608];
  char local_2438 [9224];
  
  txt = one_argument(argument,local_3638);
  txt_00 = "Personal echo what?\n\r";
  if ((*txt != '\0') && (local_3638[0] != '\0')) {
    ch_00 = get_char_world(ch,local_3638);
    if (ch_00 == (CHAR_DATA *)0x0) {
      txt_00 = "Target not found.\n\r";
    }
    else {
      iVar1 = get_trust(ch_00);
      iVar2 = get_trust(ch);
      if (iVar2 <= iVar1) {
        iVar1 = get_trust(ch);
        if (iVar1 != 0x3c) {
          send_to_char("personal> ",ch_00);
        }
      }
      colorconv(local_2438,txt,ch_00);
      send_to_char(local_2438,ch_00);
      txt_00 = "\n\r";
      send_to_char("\n\r",ch_00);
      colorconv(local_2438,txt,ch);
      send_to_char("personal> ",ch);
      send_to_char(local_2438,ch);
    }
  }
  send_to_char(txt_00,ch);
  return;
}

Assistant:

void do_pecho(CHAR_DATA *ch, char *argument)
{
	char buffer[MAX_STRING_LENGTH * 2];
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg);

	if (argument[0] == '\0' || arg[0] == '\0')
	{
		send_to_char("Personal echo what?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("Target not found.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch) && get_trust(ch) != MAX_LEVEL)
		send_to_char("personal> ", victim);

	colorconv(buffer, argument, victim);
	send_to_char(buffer, victim);
	send_to_char("\n\r", victim);

	colorconv(buffer, argument, ch);
	send_to_char("personal> ", ch);
	send_to_char(buffer, ch);
	send_to_char("\n\r", ch);
}